

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_xor_sparc(void *d,void *a,void *b,uint32_t desc)

{
  intptr_t oprsz_00;
  undefined8 local_38;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (local_38 = 0; local_38 < oprsz_00; local_38 = local_38 + 8) {
    *(ulong *)((long)d + local_38) = *(ulong *)((long)a + local_38) ^ *(ulong *)((long)b + local_38)
    ;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_xor)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint64_t)) {
        *(uint64_t *)((char *)d + i) = *(uint64_t *)((char *)a + i) ^ *(uint64_t *)((char *)b + i);
    }
    clear_high(d, oprsz, desc);
}